

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void dense2csr(CUPDLPcsr *csr,CUPDLPdense *dense)

{
  cupdlp_int iRow;
  cupdlp_int iCol;
  cupdlp_int nnz;
  CUPDLPdense *dense_local;
  CUPDLPcsr *csr_local;
  
  csr->nRows = dense->nRows;
  csr->nCols = dense->nCols;
  nnz = 0;
  *csr->rowMatBeg = 0;
  for (iRow = 0; iRow < csr->nRows; iRow = iRow + 1) {
    for (iCol = 0; iCol < csr->nCols; iCol = iCol + 1) {
      if ((dense->data[iCol * csr->nRows + iRow] != 0.0) ||
         (NAN(dense->data[iCol * csr->nRows + iRow]))) {
        csr->rowMatIdx[nnz] = iCol;
        csr->rowMatElem[nnz] = dense->data[iCol * csr->nRows + iRow];
        nnz = nnz + 1;
      }
    }
    csr->rowMatBeg[iRow + 1] = nnz;
  }
  csr->nMatElem = nnz;
  return;
}

Assistant:

void dense2csr(CUPDLPcsr *csr, CUPDLPdense *dense) {
  csr->nRows = dense->nRows;
  csr->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csr->rowMatBeg[0] = 0;
  for (iRow = 0; iRow < csr->nRows; ++iRow) {
    for (iCol = 0; iCol < csr->nCols; ++iCol) {
      if (dense->data[iCol * csr->nRows + iRow] != 0) {
        csr->rowMatIdx[nnz] = iCol;
        csr->rowMatElem[nnz] = dense->data[iCol * csr->nRows + iRow];
        ++nnz;
      }
    }
    csr->rowMatBeg[iRow + 1] = nnz;
  }
  csr->nMatElem = nnz;

  return;
}